

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O0

ErrorNumber test_default_calls(void)

{
  int iVar1;
  uint uVar2;
  double tempDouble;
  uint sign;
  uint i;
  ErrorNumber errNumber;
  double local_38;
  double local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  TA_CallForEachFunc in_stack_ffffffffffffffe8;
  uint local_8;
  
  for (local_8 = 0; local_8 < 100; local_8 = local_8 + 1) {
    inputNegData[local_8] = -(double)(int)local_8;
    inputNegData_int[local_8] = -local_8;
  }
  for (local_8 = 0; local_8 < 100; local_8 = local_8 + 1) {
    inputZeroData[local_8] = 0.0;
    inputZeroData_int[local_8] = (int)inputZeroData[local_8];
  }
  for (local_8 = 0; local_8 < 2000; local_8 = local_8 + 1) {
    iVar1 = rand();
    while( true ) {
      in_stack_ffffffffffffffe8 = (TA_CallForEachFunc)((double)iVar1 / 2147483648.0);
      in_stack_ffffffffffffffe7 =
           (double)in_stack_ffffffffffffffe8 <= 0.0 || 1.0 <= (double)in_stack_ffffffffffffffe8;
      if ((double)in_stack_ffffffffffffffe8 > 0.0 && 1.0 > (double)in_stack_ffffffffffffffe8) break;
      iVar1 = rand();
    }
    inputRandomData[local_8] = (double)in_stack_ffffffffffffffe8;
    inputRandomData_int[local_8] = (int)inputRandomData[local_8];
  }
  for (local_8 = 0; local_8 < 100; local_8 = local_8 + 1) {
    uVar2 = rand();
    local_28 = 1.0;
    if ((uVar2 & 1) == 0) {
      local_28 = -1.0;
    }
    inputRandFltEpsilon[local_8] = local_28 * 1.1920928955078125e-07;
    iVar1 = 0x7fffffff;
    if ((uVar2 & 1) != 0) {
      iVar1 = -0x7fffffff;
    }
    inputRandFltEpsilon_int[local_8] = iVar1;
  }
  for (local_8 = 0; local_8 < 100; local_8 = local_8 + 1) {
    uVar2 = rand();
    local_38 = 1.0;
    if ((uVar2 & 1) == 0) {
      local_38 = -1.0;
    }
    inputRandFltEpsilon[local_8] = local_38 * 2.220446049250313e-16;
    iVar1 = -1;
    if ((uVar2 & 1) != 0) {
      iVar1 = 1;
    }
    inputRandFltEpsilon_int[local_8] = iVar1;
  }
  if (doExtensiveProfiling != 0) {
    printf("\n[PROFILING START]\n");
  }
  TA_ForEachFunc(in_stack_ffffffffffffffe8,
                 (void *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (doExtensiveProfiling != 0) {
    printf("[PROFILING END]\n");
  }
  return TA_TEST_PASS;
}

Assistant:

static ErrorNumber test_default_calls(void)
{
   ErrorNumber errNumber;
   unsigned int i;
   unsigned int sign;
   double tempDouble;

   errNumber = TA_TEST_PASS;

   for( i=0; i < sizeof(inputNegData)/sizeof(double); i++ )
   {
      inputNegData[i] = -((double)((int)i));
	  inputNegData_int[i] = -(int)i;
   }

   for( i=0; i < sizeof(inputZeroData)/sizeof(double); i++ )
   {
      inputZeroData[i] = 0.0;
	  inputZeroData_int[i] = (int)inputZeroData[i];
   }

   for( i=0; i < sizeof(inputRandomData)/sizeof(double); i++ )
   {
      /* Make 100% sure input range is ]0..1[ */
	  tempDouble = (double)rand() / ((double)(RAND_MAX)+(double)(1));
      while( (tempDouble <= 0.0) || (tempDouble >= 1.0) )
	  {
		  tempDouble = (double)rand() / ((double)(RAND_MAX)+(double)(1));
	  }
      inputRandomData[i] = tempDouble;
      inputRandomData_int[i] = (int)inputRandomData[i];
   }

   for( i=0; i < sizeof(inputRandFltEpsilon)/sizeof(double); i++ )
   {
       sign= (unsigned int)rand()%2;
       inputRandFltEpsilon[i] = (sign?1.0:-1.0)*(FLT_EPSILON);
       inputRandFltEpsilon_int[i] = sign?TA_INTEGER_MIN:TA_INTEGER_MAX;
   }

   for( i=0; i < sizeof(inputRandFltEpsilon)/sizeof(double); i++ )
   {
       sign= (unsigned int)rand()%2;
       inputRandFltEpsilon[i] = (sign?1.0:-1.0)*(DBL_EPSILON);
       inputRandFltEpsilon_int[i] = sign?1:-1;
   }

   if( doExtensiveProfiling )
   {
		   printf( "\n[PROFILING START]\n" );
   }

   TA_ForEachFunc( testDefault, &errNumber );

   if( doExtensiveProfiling )
   {
		   printf( "[PROFILING END]\n" );
   }


   return errNumber;
}